

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86rapass.cpp
# Opt level: O0

Error __thiscall
asmjit::v1_14::x86::RACFGBuilder::onInst
          (RACFGBuilder *this,InstNode *inst,InstControlFlow *cf,RAInstBuilder *ib)

{
  int iVar1;
  undefined8 uVar2;
  uint64_t uVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  Error EVar7;
  uint32_t uVar8;
  RATiedFlags RVar9;
  uint *puVar10;
  InstInfo *pIVar11;
  unsigned_long *puVar12;
  uint32_t *puVar13;
  VirtReg **ppVVar14;
  RAWorkReg **ppRVar15;
  uint64_t uVar16;
  RATiedReg *pRVar17;
  long in_RCX;
  long lVar18;
  uint *in_RDX;
  long in_RSI;
  RAWorkReg *in_RDI;
  uint32_t predicate;
  Imm *imm_1;
  uint32_t workRegSize;
  RAWorkReg *workReg_5;
  Imm *imm;
  BaseReg *reg_1;
  InstSameRegHint sameRegHint;
  RegMask filter_1;
  RATiedReg *tiedReg;
  RATiedReg *__end4;
  RATiedReg *__begin4;
  RAInstBuilder *__range4;
  uint64_t remainingByteMask;
  OpRWInfo *opRwInfo_1;
  VirtReg *vReg;
  uint32_t vIndex_4;
  RegGroup group_4;
  Error _err_10;
  Error _err_9;
  uint32_t rewriteMask;
  RegMask inOutRegs_2;
  RegGroup group_3;
  Error _err_8;
  RAWorkReg *workReg_4;
  uint32_t vIndex_3;
  Error _err_7;
  uint32_t outRewriteMask_2;
  uint32_t useRewriteMask_2;
  uint32_t outId_2;
  uint32_t useId_2;
  RegMask inOutRegs_1;
  RegGroup group_2;
  RATiedFlags flags_2;
  Error _err_6;
  RAWorkReg *workReg_3;
  uint32_t vIndex_2;
  Error _err_5;
  uint32_t outRewriteMask_1;
  uint32_t useRewriteMask_1;
  uint32_t outId_1;
  uint32_t useId_1;
  RegMask inOutRegs;
  RegGroup group_1;
  RATiedFlags flags_1;
  Error _err_4;
  RAWorkReg *workReg_2;
  uint32_t vIndex_1;
  Error _err_3;
  RAWorkReg *workReg_1;
  Mem *mem;
  Error _err_2;
  RegMask filter;
  uint32_t outRewriteMask;
  uint32_t useRewriteMask;
  uint32_t outId;
  uint32_t useId;
  RegMask outRegs;
  RegMask useRegs;
  RegGroup group;
  Error _err_1;
  RAWorkReg *workReg;
  uint32_t vIndex;
  RegMask allowedRegs;
  RATiedFlags flags;
  Reg *reg;
  OpRWInfo *opRwInfo;
  Operand *op;
  uint32_t i;
  uint32_t consecutiveParent;
  uint32_t consecutiveLeadId;
  uint32_t consecutiveOffset;
  RegMask instructionAllowedRegs;
  uint32_t opTypesMask;
  uint32_t singleRegOps;
  bool hasGpbHiConstraint;
  InstInfo *instInfo;
  Error _err;
  Operand *opArray;
  uint32_t opCount;
  InstId instId;
  InstRWInfo rwInfo;
  uint in_stack_fffffffffffff268;
  OpRWFlags in_stack_fffffffffffff26c;
  uint in_stack_fffffffffffff270;
  uint32_t in_stack_fffffffffffff274;
  int in_stack_fffffffffffff278;
  uint32_t in_stack_fffffffffffff27c;
  uint in_stack_fffffffffffff280;
  undefined4 in_stack_fffffffffffff284;
  uint32_t in_stack_fffffffffffff2b8;
  uint32_t in_stack_fffffffffffff2bc;
  long in_stack_fffffffffffff2c0;
  undefined4 in_stack_fffffffffffff2d0;
  undefined4 in_stack_fffffffffffff2d4;
  uint local_d20;
  uint local_d1c;
  RAWorkReg *local_d18;
  Operand *local_d10;
  Operand *local_d08;
  byte local_cfd;
  uint local_cfc;
  long local_cf8;
  long local_cf0;
  long local_ce8;
  ulong local_cd8;
  OpRWInfo *local_cd0;
  VirtReg *local_cc8;
  uint local_cbc;
  byte local_cb5;
  undefined4 local_cb4;
  undefined4 local_cb0;
  uint32_t local_cac;
  int local_ca8;
  uint local_ca4;
  byte local_c9d;
  Error local_c9c;
  long local_c98;
  uint local_c90;
  undefined4 local_c8c;
  uint32_t local_c88;
  uint32_t local_c84;
  int local_c80;
  int local_c7c;
  undefined4 local_c78;
  undefined4 local_c74;
  uint local_c70;
  byte local_c69;
  RATiedFlags local_c68;
  Error local_c64;
  long local_c60;
  uint local_c58;
  undefined4 local_c54;
  uint32_t local_c50;
  uint32_t local_c4c;
  int local_c48;
  int local_c44;
  uint local_c40;
  uint local_c3c;
  uint local_c38;
  byte local_c31;
  RATiedFlags local_c30;
  Error local_c2c;
  long local_c28;
  uint local_c20;
  Error local_c1c;
  uint *local_c10;
  Error local_c04;
  uint32_t local_c00;
  uint32_t local_bfc;
  uint local_bf8;
  int local_bf4;
  int local_bf0;
  uint local_bec;
  uint local_be8;
  uint local_be4;
  uint local_be0;
  byte local_bd9;
  uint local_bd8;
  Error local_bd4;
  uint32_t *local_bd0;
  uint local_bc4;
  uint local_bc0;
  RATiedFlags local_bbc;
  uint *local_bb8;
  OpRWInfo *local_bb0;
  uint *local_ba8;
  uint in_stack_fffffffffffff460;
  uint32_t in_stack_fffffffffffff468;
  uint in_stack_fffffffffffff470;
  uint local_b8c;
  uint rmSize;
  InstRWFlags a;
  InstRWInfo *in_stack_fffffffffffff4a0;
  byte bVar19;
  size_t in_stack_fffffffffffff4a8;
  Operand_ *in_stack_fffffffffffff4b0;
  BaseInst *in_stack_fffffffffffff4b8;
  Arch in_stack_fffffffffffff4c3;
  InstInfo *in_stack_fffffffffffff660;
  InstInfo *in_stack_fffffffffffff668;
  undefined4 in_stack_fffffffffffff670;
  undefined4 in_stack_fffffffffffff674;
  undefined4 local_5b8;
  uint local_5b4;
  uint *local_5b0;
  undefined4 local_5a8;
  uint local_5a4;
  uint *local_5a0;
  uint *local_598;
  long local_560;
  long local_558;
  undefined4 *local_550;
  undefined4 local_544;
  undefined1 *local_540;
  undefined4 local_538;
  uint local_534;
  uint *local_530;
  uint *local_528;
  uint local_51c;
  undefined8 local_518;
  VirtReg *local_510;
  undefined4 local_4f4;
  long local_4f0;
  InstInfo *local_4e0;
  Operand *local_4d8;
  Operand *local_4d0;
  Operand *local_4c8;
  Operand *local_4c0;
  Operand *local_4b8;
  Operand *local_4b0;
  Operand *local_4a8;
  uint32_t local_49c;
  undefined8 local_498;
  RATiedReg *local_490;
  RAWorkReg *local_488;
  uint local_47c;
  uint *local_478;
  uint *local_470;
  Operand *local_468;
  Operand *local_460;
  Operand *local_458;
  Operand *local_450;
  Operand *local_448;
  Operand *local_440;
  Operand *local_438;
  Operand *local_430;
  Operand *local_428;
  Operand *local_420;
  uint *local_410;
  int *local_408;
  int *local_400;
  InstRWFlags local_3f4;
  InstRWFlags *local_3f0;
  undefined4 local_3e4;
  uint *local_3e0;
  undefined4 local_3d4;
  InstInfo *local_3d0;
  undefined4 local_3c4;
  InstInfo *local_3c0;
  undefined4 local_3b4;
  InstInfo *local_3b0;
  undefined4 local_3a4;
  InstInfo *local_3a0;
  undefined4 local_394;
  InstInfo *local_390;
  undefined4 local_384;
  InstInfo *local_380;
  InstInfo *local_378;
  InstInfo *local_370;
  InstInfo *local_368;
  InstInfo *local_360;
  InstInfo *local_358;
  InstInfo *local_350;
  InstInfo *local_340;
  undefined4 local_334;
  uint *local_330;
  undefined4 local_324;
  uint *local_320;
  undefined4 local_314;
  uint *local_310;
  undefined4 local_304;
  uint *local_300;
  undefined4 local_2f4;
  uint *local_2f0;
  undefined4 local_2e4;
  uint *local_2e0;
  uint32_t *local_2d8;
  uint32_t *local_2d0;
  uint32_t *local_2c8;
  uint32_t *local_2c0;
  uint32_t *local_2b8;
  uint32_t *local_2b0;
  uint32_t *local_2a8;
  uint *local_2a0;
  uint local_298 [2];
  uint *local_290;
  uint local_288 [2];
  uint *local_280;
  uint *local_278;
  uint local_26c;
  uint *local_268;
  uint local_260;
  undefined4 local_25c;
  uint *local_258;
  undefined4 local_24c;
  uint *local_248;
  undefined4 local_23c;
  uint *local_238;
  uint local_230;
  undefined4 local_22c;
  uint *local_228;
  uint local_21c;
  Operand *local_218;
  Operand *local_210;
  uint *local_208;
  uint *local_200;
  uint *local_1f8;
  uint *local_1f0;
  uint *local_1e8;
  uint *local_1e0;
  Operand *local_1d8;
  Operand *local_1d0;
  undefined4 *local_1c8;
  uint32_t *local_1c0;
  undefined4 *local_1b8;
  undefined4 *local_1b0;
  undefined4 *local_1a8;
  undefined4 *local_1a0;
  undefined4 *local_198;
  undefined4 *local_190;
  uint32_t *local_188;
  undefined4 *local_180;
  uint *local_178;
  undefined4 local_16c;
  uint *local_168;
  uint local_160;
  undefined4 local_15c;
  uint *local_158;
  uint local_14c;
  undefined4 *local_148;
  uint *local_140;
  undefined4 *local_138;
  uint *local_130;
  undefined1 local_125;
  undefined4 local_124;
  undefined1 local_11d;
  undefined4 local_11c;
  long local_118;
  long local_110;
  int *local_108;
  int *local_100;
  undefined4 local_f4;
  int *local_f0;
  undefined4 local_e4;
  int *local_e0;
  long local_d8;
  long local_d0;
  long local_c8;
  long local_c0;
  undefined4 *local_b8;
  uint *local_b0;
  uint *local_a8;
  uint *local_a0;
  uint *local_98;
  undefined1 *local_90;
  Operand *local_88;
  Operand *local_80;
  Operand *local_78;
  Operand *local_70;
  Operand *local_68;
  uint *local_60;
  uint *local_58;
  uint local_48;
  uint local_44;
  uint *local_40;
  long local_38;
  uint64_t local_30;
  uint64_t local_28;
  undefined8 local_20;
  undefined8 *local_18;
  
  local_410 = (uint *)(in_RSI + 0x30);
  if (0x6ba < *local_410) {
    return 0;
  }
  uVar6 = (uint)*(byte *)(in_RSI + 0x12);
  puVar10 = (uint *)(in_RSI + 0x40);
  EVar7 = InstInternal::queryRWInfo
                    (in_stack_fffffffffffff4c3,in_stack_fffffffffffff4b8,in_stack_fffffffffffff4b0,
                     in_stack_fffffffffffff4a8,in_stack_fffffffffffff4a0);
  if (EVar7 != 0) {
    return EVar7;
  }
  pIVar11 = InstDB::infoById(0x1e8fe6);
  bVar5 = false;
  rmSize = 0;
  a = (InstRWFlags)in_stack_fffffffffffff4a0;
  local_3f4 = a & ~kMovOp;
  local_3f0 = (InstRWFlags *)(in_RCX + 4);
  *local_3f0 = *local_3f0 | local_3f4;
  local_b8c = 0;
  if (uVar6 != 0) {
    in_stack_fffffffffffff470 = 0xffffffff;
    in_stack_fffffffffffff468 = 0xffffffff;
    local_384 = 0x800000;
    local_330 = (uint *)(InstDB::_commonInfoTable + (ulong)(*(uint *)pIVar11 >> 0xe & 0x3ff) * 8);
    local_334 = 0x800000;
    local_380 = pIVar11;
    local_378 = pIVar11;
    bVar4 = Support::test<unsigned_int,asmjit::v1_14::x86::InstDB::InstFlags>(*local_330,kEvex);
    if (bVar4) {
      local_394 = 0x400000;
      local_320 = (uint *)(InstDB::_commonInfoTable + (ulong)(*(uint *)pIVar11 >> 0xe & 0x3ff) * 8);
      local_324 = 0x400000;
      local_390 = pIVar11;
      local_370 = pIVar11;
      bVar4 = Support::test<unsigned_int,asmjit::v1_14::x86::InstDB::InstFlags>(*local_320,kVex);
      if (bVar4) {
        local_3a4 = 0x2000000;
        local_310 = (uint *)(InstDB::_commonInfoTable + (ulong)(*(uint *)pIVar11 >> 0xe & 0x3ff) * 8
                            );
        local_314 = 0x2000000;
        local_3a0 = pIVar11;
        local_368 = pIVar11;
        bVar4 = Support::test<unsigned_int,asmjit::v1_14::x86::InstDB::InstFlags>
                          (*local_310,kEvexCompat);
        if (!bVar4) {
          local_3b4 = 0x4000000;
          local_300 = (uint *)(InstDB::_commonInfoTable +
                              (ulong)(*(uint *)pIVar11 >> 0xe & 0x3ff) * 8);
          local_304 = 0x4000000;
          local_3b0 = pIVar11;
          local_360 = pIVar11;
          bVar4 = Support::test<unsigned_int,asmjit::v1_14::x86::InstDB::InstFlags>
                            (*local_300,kEvexKReg);
          if (bVar4) {
            local_298[1] = 0x289;
            local_23c = 0xff000fff;
            local_298[0] = *puVar10 & 0xff000fff;
            local_248 = local_298;
            local_24c = 0x289;
            local_2a0 = puVar10;
            local_290 = puVar10;
            local_268 = puVar10;
            local_260 = local_298[0];
            local_238 = puVar10;
            local_230 = local_298[0];
            if (local_298[0] != 0x289) {
              in_stack_fffffffffffff470 = 0xffff;
            }
          }
          else {
            local_3c4 = 0x8000000;
            local_2f0 = (uint *)(InstDB::_commonInfoTable +
                                (ulong)(*(uint *)pIVar11 >> 0xe & 0x3ff) * 8);
            local_2f4 = 0x8000000;
            in_stack_fffffffffffff660 = pIVar11;
            local_3c0 = pIVar11;
            local_358 = pIVar11;
            bVar4 = Support::test<unsigned_int,asmjit::v1_14::x86::InstDB::InstFlags>
                              (*local_2f0,kEvexTwoOp);
            if (bVar4) {
              if (uVar6 != 2) {
                in_stack_fffffffffffff470 = 0xffff;
              }
            }
            else {
              in_stack_fffffffffffff470 = 0xffff;
            }
          }
        }
      }
    }
    else {
      local_3d4 = 0x10000000;
      local_2e0 = (uint *)(InstDB::_commonInfoTable + (ulong)(*(uint *)pIVar11 >> 0xe & 0x3ff) * 8);
      local_2e4 = 0x10000000;
      in_stack_fffffffffffff668 = pIVar11;
      local_3d0 = pIVar11;
      local_350 = pIVar11;
      bVar4 = Support::test<unsigned_int,asmjit::v1_14::x86::InstDB::InstFlags>
                        (*local_2e0,kEvexTransformable);
      if (bVar4) {
        in_stack_fffffffffffff674 = 0x80000000;
        *(uint *)(in_RCX + 8) = *(uint *)(in_RCX + 8) | 0x80000000;
      }
      else {
        in_stack_fffffffffffff470 = 0xffff;
      }
    }
    for (in_stack_fffffffffffff460 = 0; a = (InstRWFlags)in_stack_fffffffffffff4a0,
        in_stack_fffffffffffff460 < uVar6; in_stack_fffffffffffff460 = in_stack_fffffffffffff460 + 1
        ) {
      local_ba8 = puVar10 + (ulong)in_stack_fffffffffffff460 * 4;
      local_bb0 = InstRWInfo::operand((InstRWInfo *)
                                      CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270),
                                      CONCAT44(in_stack_fffffffffffff26c,in_stack_fffffffffffff268))
      ;
      local_1f8 = local_ba8;
      local_1f0 = local_ba8;
      local_b8c = 1 << ((byte)*local_ba8 & 7) | local_b8c;
      local_200 = local_ba8;
      local_1e8 = local_ba8;
      if ((*local_ba8 & 7) == 1) {
        local_bb8 = local_ba8;
        local_bbc = raRegRwFlags(kNone);
        local_bc0 = in_stack_fffffffffffff470;
        in_stack_fffffffffffff470 = local_bc0;
        bVar4 = Support::test<asmjit::v1_14::OpRWFlags,asmjit::v1_14::OpRWFlags>
                          (local_bb0->_opFlags,kUnique);
        if (bVar4) {
          local_bbc = local_bbc | kUnique;
        }
        local_470 = local_bb8;
        local_60 = local_bb8;
        if ((*local_bb8 >> 0x18 == 1) &&
           (bVar4 = Support::test<asmjit::v1_14::OpRWFlags,asmjit::v1_14::OpRWFlags>
                              (local_bb0->_opFlags,kRegPhysId), !bVar4)) {
          local_bbc = local_bbc | kX86_Gpb;
          if (((byte)in_RDI[0x291] & 1) == 0) {
            local_bc0 = 0xf;
          }
          else {
            local_280 = local_bb8;
            local_288[1] = 0x1000021;
            local_278 = local_bb8;
            local_228 = local_bb8;
            local_22c = 0xff000fff;
            local_288[0] = *local_bb8 & 0xff000fff;
            local_258 = local_288;
            local_25c = 0x1000021;
            local_26c = local_288[0];
            local_21c = local_288[0];
            if (local_288[0] == 0x1000021) {
              bVar5 = true;
              local_bc0 = 0xf;
            }
          }
        }
        local_bc4 = local_bb8[1] - 0x100;
        if (local_bc4 < 0xfffffeff) {
          local_bd4 = BaseRAPass::virtIndexAsWorkReg
                                ((BaseRAPass *)
                                 CONCAT44(in_stack_fffffffffffff284,in_stack_fffffffffffff280),
                                 in_stack_fffffffffffff27c,
                                 (RAWorkReg **)
                                 CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270));
          if (local_bd4 != 0) {
            return local_bd4;
          }
          if (((local_bbc & kRW) == kWrite) &&
             ((*(ulong *)(local_bd0 + 0x10) &
              ((local_bb0->_writeByteMask | local_bb0->_extendByteMask) ^ 0xffffffffffffffff)) != 0)
             ) {
            local_bbc = local_bbc & ~kOut | (kUse|kRead);
          }
          if (((char)(in_stack_fffffffffffff4a8 >> 0x28) != '\0') &&
             (bVar4 = Support::test<asmjit::v1_14::RATiedFlags,asmjit::v1_14::RATiedFlags>
                                (local_bbc,kOutRM|kUseRM), bVar4)) {
            in_stack_fffffffffffff2c0 = *(long *)(*(long *)(in_RDI + 8) + 0x30) + 8;
            bVar19 = (byte)(in_stack_fffffffffffff4a8 >> 0x28);
            local_bd8 = (uint)bVar19;
            local_40 = &local_bd8;
            local_38 = in_stack_fffffffffffff2c0;
            if (0xff < local_bd8) {
              DebugUtils::assertionFailed
                        ((char *)CONCAT44(in_stack_fffffffffffff674,in_stack_fffffffffffff670),
                         (int)((ulong)in_stack_fffffffffffff668 >> 0x20),
                         (char *)in_stack_fffffffffffff660);
            }
            local_44 = (uint)(bVar19 >> 6);
            local_48 = local_bd8 & 0x3f;
            puVar12 = Support::Array<unsigned_long,_4UL>::operator[]<unsigned_int>
                                ((Array<unsigned_long,_4UL> *)
                                 CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270),
                                 (uint *)CONCAT44(in_stack_fffffffffffff26c,
                                                  in_stack_fffffffffffff268));
            if ((*puVar12 >> ((byte)local_48 & 0x3f) & 1) == 0) {
              local_bbc = local_bbc & ~(kOutRM|kUseRM);
            }
          }
          local_1c0 = local_bd0 + 8;
          local_bd9 = (byte)(*local_1c0 >> 8) & 0xf;
          local_188 = local_1c0;
          puVar13 = RARegMask::operator[]<asmjit::v1_14::RegGroup>
                              ((RARegMask *)
                               CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270),
                               (RegGroup *)
                               CONCAT44(in_stack_fffffffffffff26c,in_stack_fffffffffffff268));
          local_be4 = *puVar13 & local_bc0;
          local_be8 = 0xff;
          local_bec = 0xff;
          local_bf0 = 0;
          local_bf4 = 0;
          local_be0 = local_be4;
          if (local_bb0->_consecutiveLeadCount != '\0') {
            if (in_stack_fffffffffffff468 != 0xffffffff) {
              EVar7 = DebugUtils::errored(3);
              return EVar7;
            }
            uVar8 = RATiedReg::consecutiveDataFromFlags(local_bbc);
            if (uVar8 != 0) {
              EVar7 = DebugUtils::errored(0x3c);
              return EVar7;
            }
            RVar9 = RATiedReg::consecutiveDataToFlags(0);
            local_bbc = local_bbc | RVar9 | kLeadConsecutive;
            in_stack_fffffffffffff468 = *local_bd0;
            local_bf8 = *(uint *)(raConsecutiveLeadCountToRegMaskFilter +
                                 (ulong)local_bb0->_consecutiveLeadCount * 4);
            bVar4 = Support::test<asmjit::v1_14::RATiedFlags,asmjit::v1_14::RATiedFlags>
                              (local_bbc,kUse);
            if (bVar4) {
              local_bbc = local_bbc | kUseConsecutive;
              local_be0 = local_bf8 & local_be0;
            }
            else {
              local_bbc = local_bbc | kOutConsecutive;
              local_be4 = local_bf8 & local_be4;
            }
          }
          bVar4 = Support::test<asmjit::v1_14::RATiedFlags,asmjit::v1_14::RATiedFlags>
                            (local_bbc,kUse);
          if (bVar4) {
            local_bfc = InstNode::getRewriteIndex
                                  ((InstNode *)
                                   CONCAT44(in_stack_fffffffffffff27c,in_stack_fffffffffffff278),
                                   (uint32_t *)
                                   CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270));
            local_2d8 = &local_bfc;
            local_bf0 = 1 << ((byte)local_bfc & 0x1f);
            bVar4 = Support::test<asmjit::v1_14::OpRWFlags,asmjit::v1_14::OpRWFlags>
                              (local_bb0->_opFlags,kRegPhysId);
            if (bVar4) {
              local_be8 = (uint)local_bb0->_physId;
              local_bbc = local_bbc | kUseFixed;
            }
            else {
              bVar4 = Support::test<asmjit::v1_14::OpRWFlags,asmjit::v1_14::OpRWFlags>
                                (local_bb0->_opFlags,kConsecutive);
              if (bVar4) {
                if (in_stack_fffffffffffff468 == 0xffffffff) {
                  EVar7 = DebugUtils::errored(3);
                  return EVar7;
                }
                if (in_stack_fffffffffffff468 == *local_bd0) {
                  EVar7 = DebugUtils::errored(0x41);
                  return EVar7;
                }
                RVar9 = RATiedReg::consecutiveDataToFlags(0);
                local_bbc = local_bbc | RVar9 | kUseConsecutive;
              }
            }
          }
          else {
            local_c00 = InstNode::getRewriteIndex
                                  ((InstNode *)
                                   CONCAT44(in_stack_fffffffffffff27c,in_stack_fffffffffffff278),
                                   (uint32_t *)
                                   CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270));
            local_2d0 = &local_c00;
            local_bf4 = 1 << ((byte)local_c00 & 0x1f);
            bVar4 = Support::test<asmjit::v1_14::OpRWFlags,asmjit::v1_14::OpRWFlags>
                              (local_bb0->_opFlags,kRegPhysId);
            if (bVar4) {
              local_bec = (uint)local_bb0->_physId;
              local_bbc = local_bbc | kOutFixed;
            }
            else {
              bVar4 = Support::test<asmjit::v1_14::OpRWFlags,asmjit::v1_14::OpRWFlags>
                                (local_bb0->_opFlags,kConsecutive);
              if (bVar4) {
                if (in_stack_fffffffffffff468 == 0xffffffff) {
                  EVar7 = DebugUtils::errored(3);
                  return EVar7;
                }
                if (in_stack_fffffffffffff468 == *local_bd0) {
                  EVar7 = DebugUtils::errored(0x41);
                  return EVar7;
                }
                RVar9 = RATiedReg::consecutiveDataToFlags(0);
                local_bbc = local_bbc | RVar9 | kOutConsecutive;
              }
            }
          }
          in_stack_fffffffffffff280 = (uint)local_bb0->_rmSize;
          in_stack_fffffffffffff268 = local_be4;
          in_stack_fffffffffffff270 = local_bec;
          in_stack_fffffffffffff278 = local_bf4;
          local_c04 = RAInstBuilder::add((RAInstBuilder *)
                                         CONCAT44(in_stack_fffffffffffff2d4,
                                                  in_stack_fffffffffffff2d0),in_RDI,
                                         (RATiedFlags)((ulong)in_stack_fffffffffffff2c0 >> 0x20),
                                         (RegMask)in_stack_fffffffffffff2c0,
                                         in_stack_fffffffffffff2bc,in_stack_fffffffffffff2b8,
                                         in_stack_fffffffffffff460,in_stack_fffffffffffff468,
                                         in_stack_fffffffffffff470,rmSize,(uint32_t)pIVar11);
          if (local_c04 != 0) {
            return local_c04;
          }
          if (rmSize == in_stack_fffffffffffff460) {
            rmSize = rmSize + 1;
          }
          Support::test<asmjit::v1_14::RATiedFlags,asmjit::v1_14::RATiedFlags>
                    (local_bbc,kLeadConsecutive|kOutConsecutive|kUseConsecutive);
        }
      }
      else {
        local_208 = local_ba8;
        local_1e0 = local_ba8;
        if ((*local_ba8 & 7) == 2) {
          local_c10 = local_ba8;
          *(uint *)(in_RCX + 0xc) = *(uint *)(in_RCX + 0xc) | 0x30;
          local_178 = local_ba8;
          if ((*local_ba8 & 0x2000) == 0) {
            local_5b0 = local_ba8;
            local_158 = local_ba8;
            local_15c = 0xf8;
            local_5b4 = *local_ba8 & 0xf8;
            local_130 = &local_5b4;
            local_125 = 1;
            local_5b8 = 8;
            local_138 = &local_5b8;
            local_14c = local_5b4;
            local_124 = local_5b8;
            if ((8 < local_5b4) && (local_c20 = local_ba8[1] - 0x100, local_c20 < 0xfffffeff)) {
              local_c2c = BaseRAPass::virtIndexAsWorkReg
                                    ((BaseRAPass *)
                                     CONCAT44(in_stack_fffffffffffff284,in_stack_fffffffffffff280),
                                     in_stack_fffffffffffff27c,
                                     (RAWorkReg **)
                                     CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270));
              if (local_c2c != 0) {
                return local_c2c;
              }
              local_c30 = raMemBaseRwFlags(in_stack_fffffffffffff26c);
              local_1b8 = (undefined4 *)(local_c28 + 0x20);
              local_c31 = (byte)((uint)*local_1b8 >> 8) & 0xf;
              local_190 = local_1b8;
              puVar13 = RARegMask::operator[]<asmjit::v1_14::RegGroup>
                                  ((RARegMask *)
                                   CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270),
                                   (RegGroup *)
                                   CONCAT44(in_stack_fffffffffffff26c,in_stack_fffffffffffff268));
              local_c38 = *puVar13;
              local_c3c = 0xff;
              local_c40 = 0xff;
              local_c44 = 0;
              local_c48 = 0;
              bVar4 = Support::test<asmjit::v1_14::RATiedFlags,asmjit::v1_14::RATiedFlags>
                                (local_c30,kUse);
              if (bVar4) {
                local_c4c = InstNode::getRewriteIndex
                                      ((InstNode *)
                                       CONCAT44(in_stack_fffffffffffff27c,in_stack_fffffffffffff278)
                                       ,(uint32_t *)
                                        CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270
                                                ));
                local_2c8 = &local_c4c;
                local_c44 = 1 << ((byte)local_c4c & 0x1f);
                bVar4 = Support::test<asmjit::v1_14::OpRWFlags,asmjit::v1_14::OpRWFlags>
                                  (local_bb0->_opFlags,kMemPhysId);
                if (bVar4) {
                  local_c3c = (uint)local_bb0->_physId;
                  local_c30 = local_c30 | kUseFixed;
                }
              }
              else {
                local_c50 = InstNode::getRewriteIndex
                                      ((InstNode *)
                                       CONCAT44(in_stack_fffffffffffff27c,in_stack_fffffffffffff278)
                                       ,(uint32_t *)
                                        CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270
                                                ));
                local_2c0 = &local_c50;
                local_c48 = 1 << ((byte)local_c50 & 0x1f);
                bVar4 = Support::test<asmjit::v1_14::OpRWFlags,asmjit::v1_14::OpRWFlags>
                                  (local_bb0->_opFlags,kMemPhysId);
                if (bVar4) {
                  local_c40 = (uint)local_bb0->_physId;
                  local_c30 = local_c30 | kOutFixed;
                }
              }
              in_stack_fffffffffffff280 = 0;
              in_stack_fffffffffffff268 = local_c38;
              in_stack_fffffffffffff270 = local_c40;
              in_stack_fffffffffffff278 = local_c48;
              EVar7 = RAInstBuilder::add((RAInstBuilder *)
                                         CONCAT44(in_stack_fffffffffffff2d4,
                                                  in_stack_fffffffffffff2d0),in_RDI,
                                         (RATiedFlags)((ulong)in_stack_fffffffffffff2c0 >> 0x20),
                                         (RegMask)in_stack_fffffffffffff2c0,
                                         in_stack_fffffffffffff2bc,in_stack_fffffffffffff2b8,
                                         in_stack_fffffffffffff460,in_stack_fffffffffffff468,
                                         in_stack_fffffffffffff470,rmSize,(uint32_t)pIVar11);
              if (EVar7 != 0) {
                return EVar7;
              }
              local_c54 = 0;
            }
          }
          else {
            local_c1c = BaseRAPass::virtIndexAsWorkReg
                                  ((BaseRAPass *)
                                   CONCAT44(in_stack_fffffffffffff284,in_stack_fffffffffffff280),
                                   in_stack_fffffffffffff27c,
                                   (RAWorkReg **)
                                   CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270));
            if (local_c1c != 0) {
              return local_c1c;
            }
            BaseRAPass::getOrCreateStackSlot
                      ((BaseRAPass *)CONCAT44(in_stack_fffffffffffff284,in_stack_fffffffffffff280),
                       (RAWorkReg *)CONCAT44(in_stack_fffffffffffff27c,in_stack_fffffffffffff278));
          }
          local_5a0 = local_c10;
          local_168 = local_c10;
          local_16c = 0x1f00;
          local_5a4 = *local_c10 & 0x1f00;
          local_140 = &local_5a4;
          local_11d = 1;
          local_5a8 = 0x100;
          local_148 = &local_5a8;
          local_160 = local_5a4;
          local_11c = local_5a8;
          if (0x100 < local_5a4) {
            local_598 = local_c10;
            local_c58 = local_c10[2] - 0x100;
            if (local_c58 < 0xfffffeff) {
              local_c64 = BaseRAPass::virtIndexAsWorkReg
                                    ((BaseRAPass *)
                                     CONCAT44(in_stack_fffffffffffff284,in_stack_fffffffffffff280),
                                     in_stack_fffffffffffff27c,
                                     (RAWorkReg **)
                                     CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270));
              if (local_c64 != 0) {
                return local_c64;
              }
              local_c68 = raMemIndexRwFlags(in_stack_fffffffffffff26c);
              local_1b0 = (undefined4 *)(local_c60 + 0x20);
              local_c69 = (byte)((uint)*local_1b0 >> 8) & 0xf;
              local_198 = local_1b0;
              puVar13 = RARegMask::operator[]<asmjit::v1_14::RegGroup>
                                  ((RARegMask *)
                                   CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270),
                                   (RegGroup *)
                                   CONCAT44(in_stack_fffffffffffff26c,in_stack_fffffffffffff268));
              local_c70 = *puVar13 & in_stack_fffffffffffff470;
              local_c74 = 0xff;
              local_c78 = 0xff;
              local_c7c = 0;
              local_c80 = 0;
              bVar4 = Support::test<asmjit::v1_14::RATiedFlags,asmjit::v1_14::RATiedFlags>
                                (local_c68,kUse);
              if (bVar4) {
                local_c84 = InstNode::getRewriteIndex
                                      ((InstNode *)
                                       CONCAT44(in_stack_fffffffffffff27c,in_stack_fffffffffffff278)
                                       ,(uint32_t *)
                                        CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270
                                                ));
                local_2b8 = &local_c84;
                local_c7c = 1 << ((byte)local_c84 & 0x1f);
              }
              else {
                local_c88 = InstNode::getRewriteIndex
                                      ((InstNode *)
                                       CONCAT44(in_stack_fffffffffffff27c,in_stack_fffffffffffff278)
                                       ,(uint32_t *)
                                        CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270
                                                ));
                local_2b0 = &local_c88;
                local_c80 = 1 << ((byte)local_c88 & 0x1f);
              }
              in_stack_fffffffffffff270 = 0xff;
              in_stack_fffffffffffff280 = 0;
              in_stack_fffffffffffff268 = local_c70;
              in_stack_fffffffffffff278 = local_c80;
              EVar7 = RAInstBuilder::add((RAInstBuilder *)
                                         CONCAT44(in_stack_fffffffffffff2d4,
                                                  in_stack_fffffffffffff2d0),in_RDI,
                                         (RATiedFlags)((ulong)in_stack_fffffffffffff2c0 >> 0x20),
                                         (RegMask)in_stack_fffffffffffff2c0,
                                         in_stack_fffffffffffff2bc,in_stack_fffffffffffff2b8,
                                         in_stack_fffffffffffff460,in_stack_fffffffffffff468,
                                         in_stack_fffffffffffff470,rmSize,(uint32_t)pIVar11);
              if (EVar7 != 0) {
                return EVar7;
              }
              local_c8c = 0;
            }
          }
        }
      }
    }
  }
  local_118 = in_RSI + 0x30;
  local_100 = (int *)(in_RSI + 0x38);
  local_f4 = 0;
  local_f0 = local_100;
  if (*local_100 != 0) {
    local_d8 = in_RSI + 0x30;
    local_558 = in_RSI + 0x38;
    local_c90 = *(int *)(in_RSI + 0x3c) - 0x100;
    if (local_c90 < 0xfffffeff) {
      local_c9c = BaseRAPass::virtIndexAsWorkReg
                            ((BaseRAPass *)
                             CONCAT44(in_stack_fffffffffffff284,in_stack_fffffffffffff280),
                             in_stack_fffffffffffff27c,
                             (RAWorkReg **)
                             CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270));
      if (local_c9c != 0) {
        return local_c9c;
      }
      local_1a8 = (undefined4 *)(local_c98 + 0x20);
      local_c9d = (byte)((uint)*local_1a8 >> 8) & 0xf;
      local_1a0 = local_1a8;
      puVar13 = RARegMask::operator[]<asmjit::v1_14::RegGroup>
                          ((RARegMask *)
                           CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270),
                           (RegGroup *)CONCAT44(in_stack_fffffffffffff26c,in_stack_fffffffffffff268)
                          );
      local_ca4 = *puVar13;
      local_d0 = in_RSI + 0x30;
      local_cac = InstNode::getRewriteIndex
                            ((InstNode *)
                             CONCAT44(in_stack_fffffffffffff27c,in_stack_fffffffffffff278),
                             (uint32_t *)
                             CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270));
      local_2a8 = &local_cac;
      local_ca8 = 1 << ((byte)local_cac & 0x1f);
      RVar9 = (RATiedFlags)((ulong)in_stack_fffffffffffff2c0 >> 0x20);
      in_stack_fffffffffffff268 = local_ca4;
      if (local_c9d == 2) {
        in_stack_fffffffffffff270 = 0xff;
        in_stack_fffffffffffff278 = 0;
        EVar7 = RAInstBuilder::add((RAInstBuilder *)
                                   CONCAT44(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2d0),
                                   in_RDI,RVar9,(RegMask)in_stack_fffffffffffff2c0,
                                   in_stack_fffffffffffff2bc,in_stack_fffffffffffff2b8,
                                   in_stack_fffffffffffff460,in_stack_fffffffffffff468,
                                   in_stack_fffffffffffff470,rmSize,(uint32_t)pIVar11);
        if (EVar7 != 0) {
          return EVar7;
        }
        rmSize = 0;
        local_cb0 = 0;
      }
      else {
        in_stack_fffffffffffff270 = 0xff;
        in_stack_fffffffffffff278 = 0;
        EVar7 = RAInstBuilder::add((RAInstBuilder *)
                                   CONCAT44(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2d0),
                                   in_RDI,RVar9,(RegMask)in_stack_fffffffffffff2c0,
                                   in_stack_fffffffffffff2bc,in_stack_fffffffffffff2b8,
                                   in_stack_fffffffffffff460,in_stack_fffffffffffff468,
                                   in_stack_fffffffffffff470,rmSize,(uint32_t)pIVar11);
        if (EVar7 != 0) {
          return EVar7;
        }
        local_cb4 = 0;
      }
    }
    else {
      local_c8 = in_RSI + 0x30;
      local_550 = (undefined4 *)(in_RSI + 0x38);
      local_cb5 = (byte)((uint)*local_550 >> 8) & 0xf;
      local_1c8 = local_550;
      local_180 = local_550;
      if (local_cb5 == 2) {
        local_c0 = in_RSI + 0x30;
        local_560 = in_RSI + 0x38;
        if (*(int *)(in_RSI + 0x3c) != 0) {
          rmSize = 0;
        }
      }
    }
  }
  local_540 = &stack0xfffffffffffff4a0;
  local_544 = 1;
  bVar4 = Support::test<asmjit::v1_14::InstRWFlags,asmjit::v1_14::InstRWFlags>(a,kMovOp);
  if (bVar4) {
    local_110 = in_RSI + 0x30;
    local_108 = (int *)(in_RSI + 0x38);
    local_e4 = 0;
    local_e0 = local_108;
    if (*local_108 == 0) {
      local_534 = local_b8c;
      local_538 = 1;
      local_b8 = &local_538;
      if ((((local_b8c & 2) != 0) &&
          ((uVar6 == 2 ||
           ((uVar6 == 3 &&
            (local_530 = (uint *)(in_RSI + 0x50), local_528 = puVar10, local_b0 = local_530,
            local_a8 = puVar10, local_a0 = local_530, local_98 = puVar10,
            ((*puVar10 == *local_530 && *(int *)(in_RSI + 0x44) == *(int *)(in_RSI + 0x54)) &&
            *(int *)(in_RSI + 0x48) == *(int *)(in_RSI + 0x58)) &&
            *(int *)(in_RSI + 0x4c) == *(int *)(in_RSI + 0x5c))))))) &&
         (local_cbc = *(int *)(in_RSI + 0x44) - 0x100, local_cbc < 0xfffffeff)) {
        local_518 = *(undefined8 *)(in_RDI + 8);
        local_51c = local_cbc;
        ppVVar14 = ZoneVector<asmjit::v1_14::VirtReg_*>::operator[]
                             ((ZoneVector<asmjit::v1_14::VirtReg_*> *)
                              CONCAT44(in_stack_fffffffffffff27c,in_stack_fffffffffffff278),
                              CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270));
        local_cc8 = *ppVVar14;
        local_cd0 = InstRWInfo::operand((InstRWInfo *)
                                        CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270
                                                ),
                                        CONCAT44(in_stack_fffffffffffff26c,in_stack_fffffffffffff268
                                                ));
        local_510 = local_cc8;
        local_cd8 = *(ulong *)(*(long *)(local_cc8 + 0x28) + 0x40) &
                    (local_cd0->_writeByteMask ^ 0xffffffffffffffff);
        if ((local_cd8 == 0) || ((local_cd8 & local_cd0->_extendByteMask) == 0)) {
          local_3e0 = (uint *)(in_RCX + 4);
          local_3e4 = 1;
          *local_3e0 = *local_3e0 | 1;
        }
      }
    }
  }
  if (bVar5) {
    local_cf0 = *(long *)(in_RCX + 0x38);
    for (local_ce8 = in_RCX + 0x40; local_ce8 != local_cf0; local_ce8 = local_ce8 + 0x20) {
      local_cf8 = local_ce8;
      local_4f0 = local_ce8;
      local_4f4 = 0x1000000;
      bVar5 = Support::test<asmjit::v1_14::RATiedFlags,asmjit::v1_14::RATiedFlags>
                        (*(RATiedFlags *)(local_ce8 + 8),kX86_Gpb);
      local_cfc = 0xff;
      if (bVar5) {
        local_cfc = 0xf;
      }
      *(uint *)(local_cf8 + 0x10) = local_cfc & *(uint *)(local_cf8 + 0x10);
      *(uint *)(local_cf8 + 0x14) = local_cfc & *(uint *)(local_cf8 + 0x14);
    }
  }
  if ((int)(*(long *)(in_RCX + 0x38) - (in_RCX + 0x40) >> 5) != 1) goto LAB_001ebe75;
  local_cfd = 0;
  if (rmSize == uVar6) {
    lVar18 = (ulong)(*(uint *)pIVar11 >> 0xe & 0x3ff) * 8;
    local_90 = InstDB::_commonInfoTable + lVar18;
    local_cfd = (byte)((uint)*(undefined4 *)(InstDB::_commonInfoTable + lVar18 + 4) >> 0x1e);
    local_4e0 = pIVar11;
    local_340 = pIVar11;
  }
  else if ((uVar6 == 2) &&
          (local_4c8 = InstNode::op((InstNode *)
                                    CONCAT44(in_stack_fffffffffffff27c,in_stack_fffffffffffff278),
                                    in_stack_fffffffffffff274), local_4c0 = local_4c8,
          local_218 = local_4c8, local_1d0 = local_4c8,
          ((local_4c8->super_Operand_)._signature._bits & 7) == 4)) {
    local_d08 = InstNode::op((InstNode *)
                             CONCAT44(in_stack_fffffffffffff27c,in_stack_fffffffffffff278),
                             in_stack_fffffffffffff274);
    local_4b8 = local_d08;
    local_d10 = InstNode::op((InstNode *)
                             CONCAT44(in_stack_fffffffffffff27c,in_stack_fffffffffffff278),
                             in_stack_fffffffffffff274);
    uVar2 = *(undefined8 *)in_RDI;
    local_4a8 = local_d10;
    local_490 = RAInstBuilder::operator[]
                          ((RAInstBuilder *)
                           CONCAT44(in_stack_fffffffffffff27c,in_stack_fffffffffffff278),
                           CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270));
    local_49c = local_490->_workId;
    local_498 = uVar2;
    ppRVar15 = ZoneVector<asmjit::v1_14::RAWorkReg_*>::operator[]
                         ((ZoneVector<asmjit::v1_14::RAWorkReg_*> *)
                          CONCAT44(in_stack_fffffffffffff27c,in_stack_fffffffffffff278),
                          CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270));
    local_d18 = *ppRVar15;
    local_d20 = *(uint *)(local_d18 + 0x20);
    local_478 = &local_d20;
    local_d1c = local_d20 >> 0x18;
    local_408 = (int *)(in_RSI + 0x30);
    iVar1 = *local_408;
    local_488 = local_d18;
    local_47c = local_d20;
    local_58 = local_478;
    if ((iVar1 != 9) && (iVar1 != 0x17)) {
      if (iVar1 == 0x1eb) {
        local_448 = local_d08;
        local_88 = local_d08;
        if ((local_d08->super_Operand_)._signature._bits >> 0x18 < 4) {
          local_450 = local_d08;
          local_80 = local_d08;
          if ((local_d08->super_Operand_)._signature._bits >> 0x18 < local_d1c) goto LAB_001ebc4a;
        }
        local_430 = local_d10;
        if (*(long *)(local_d10->super_Operand_)._data != -1) {
          local_428 = local_d10;
          local_420 = local_d10;
          uVar3 = *(uint64_t *)(local_d10->super_Operand_)._data;
          local_20 = 1;
          local_18 = &local_20;
          local_458 = local_d08;
          local_78 = local_d08;
          local_30 = uVar3;
          local_28 = uVar3;
          uVar16 = raImmMaskFromSize(in_stack_fffffffffffff26c);
          if (uVar3 != uVar16) goto LAB_001ebc4a;
        }
        local_cfd = 2;
      }
      else if ((((1 < iVar1 - 0x2b7U) && (iVar1 != 0x2c4)) && (iVar1 != 0x2f6)) &&
              (((iVar1 != 0x2f9 && (iVar1 != 0x311)) && (iVar1 != 0x6a8)))) goto LAB_001ebe18;
    }
LAB_001ebc4a:
    local_460 = local_d08;
    local_70 = local_d08;
    if ((local_d08->super_Operand_)._signature._bits >> 0x18 == 4) {
      local_468 = local_d08;
      local_68 = local_d08;
      if ((local_d08->super_Operand_)._signature._bits >> 0x18 < local_d1c) goto LAB_001ebe18;
    }
    local_438 = local_d10;
    if (*(long *)(local_d10->super_Operand_)._data == 0) {
      local_cfd = 1;
    }
  }
  else if ((uVar6 == 4) &&
          (local_4d8 = InstNode::op((InstNode *)
                                    CONCAT44(in_stack_fffffffffffff27c,in_stack_fffffffffffff278),
                                    in_stack_fffffffffffff274), local_4d0 = local_4d8,
          local_210 = local_4d8, local_1d8 = local_4d8,
          ((local_4d8->super_Operand_)._signature._bits & 7) == 4)) {
    local_4b0 = InstNode::op((InstNode *)
                             CONCAT44(in_stack_fffffffffffff27c,in_stack_fffffffffffff278),
                             in_stack_fffffffffffff274);
    local_400 = (int *)(in_RSI + 0x30);
    if ((*local_400 == 0x61c || *local_400 == 0x61d) &&
       ((uVar6 = (local_4b0->super_Operand_)._data[0] & 0xff, local_440 = local_4b0, uVar6 == 0 ||
        (uVar6 == 0xff)))) {
      pRVar17 = RAInstBuilder::operator[]
                          ((RAInstBuilder *)
                           CONCAT44(in_stack_fffffffffffff27c,in_stack_fffffffffffff278),
                           CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270));
      RATiedReg::makeWriteOnly(pRVar17);
    }
  }
LAB_001ebe18:
  if (local_cfd != 0) {
    if (local_cfd == 1) {
      pRVar17 = RAInstBuilder::operator[]
                          ((RAInstBuilder *)
                           CONCAT44(in_stack_fffffffffffff27c,in_stack_fffffffffffff278),
                           CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270));
      RATiedReg::makeReadOnly(pRVar17);
    }
    else if (local_cfd == 2) {
      pRVar17 = RAInstBuilder::operator[]
                          ((RAInstBuilder *)
                           CONCAT44(in_stack_fffffffffffff27c,in_stack_fffffffffffff278),
                           CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270));
      RATiedReg::makeWriteOnly(pRVar17);
    }
  }
LAB_001ebe75:
  *in_RDX = *(uint *)(InstDB::_commonInfoTable + (ulong)(*(uint *)pIVar11 >> 0xe & 0x3ff) * 8 + 4)
            >> 0x1b & 7;
  return 0;
}

Assistant:

Error RACFGBuilder::onInst(InstNode* inst, InstControlFlow& cf, RAInstBuilder& ib) noexcept {
  InstRWInfo rwInfo;

  InstId instId = inst->id();
  if (Inst::isDefinedId(instId)) {
    uint32_t opCount = inst->opCount();
    const Operand* opArray = inst->operands();
    ASMJIT_PROPAGATE(InstInternal::queryRWInfo(_arch, inst->baseInst(), opArray, opCount, &rwInfo));

    const InstDB::InstInfo& instInfo = InstDB::infoById(instId);
    bool hasGpbHiConstraint = false;
    uint32_t singleRegOps = 0;

    // Copy instruction RW flags to instruction builder except kMovOp, which is propagated manually later.
    ib.addInstRWFlags(rwInfo.instFlags() & ~InstRWFlags::kMovOp);

    // Mask of all operand types used by the instruction - can be used as an optimization later.
    uint32_t opTypesMask = 0u;

    if (opCount) {
      // The mask is for all registers, but we are mostly interested in AVX-512 registers at the moment. The mask
      // will be combined with all available registers of the Compiler at the end so we it never use more registers
      // than available.
      RegMask instructionAllowedRegs = 0xFFFFFFFFu;

      uint32_t consecutiveOffset = 0;
      uint32_t consecutiveLeadId = Globals::kInvalidId;
      uint32_t consecutiveParent = Globals::kInvalidId;

      if (instInfo.isEvex()) {
        // EVEX instruction and VEX instructions that can be encoded with EVEX have the possibility to use 32 SIMD
        // registers (XMM/YMM/ZMM).
        if (instInfo.isVex() && !instInfo.isEvexCompatible()) {
          if (instInfo.isEvexKRegOnly()) {
            // EVEX encodable only if the first operand is K register (compare instructions).
            if (!Reg::isKReg(opArray[0]))
              instructionAllowedRegs = 0xFFFFu;
          }
          else if (instInfo.isEvexTwoOpOnly()) {
            // EVEX encodable only if the instruction has two operands (gather instructions).
            if (opCount != 2)
              instructionAllowedRegs = 0xFFFFu;
          }
          else {
            instructionAllowedRegs = 0xFFFFu;
          }
        }
      }
      else if (instInfo.isEvexTransformable()) {
        ib.addAggregatedFlags(RATiedFlags::kInst_IsTransformable);
      }
      else {
        // Not EVEX, restrict everything to [0-15] registers.
        instructionAllowedRegs = 0xFFFFu;
      }

      for (uint32_t i = 0; i < opCount; i++) {
        const Operand& op = opArray[i];
        const OpRWInfo& opRwInfo = rwInfo.operand(i);

        opTypesMask |= 1u << uint32_t(op.opType());

        if (op.isReg()) {
          // Register Operand
          // ----------------
          const Reg& reg = op.as<Reg>();

          RATiedFlags flags = raRegRwFlags(opRwInfo.opFlags());
          RegMask allowedRegs = instructionAllowedRegs;

          if (opRwInfo.isUnique())
            flags |= RATiedFlags::kUnique;

          // X86-specific constraints related to LO|HI general purpose registers. This is only required when the
          // register is part of the encoding. If the register is fixed we won't restrict anything as it doesn't
          // restrict encoding of other registers.
          if (reg.isGpb() && !opRwInfo.hasOpFlag(OpRWFlags::kRegPhysId)) {
            flags |= RATiedFlags::kX86_Gpb;
            if (!_is64Bit) {
              // Restrict to first four - AL|AH|BL|BH|CL|CH|DL|DH. In 32-bit mode it's not possible to access
              // SIL|DIL, etc, so this is just enough.
              allowedRegs = 0x0Fu;
            }
            else {
              // If we encountered GPB-HI register the situation is much more complicated than in 32-bit mode.
              // We need to patch all registers to not use ID higher than 7 and all GPB-LO registers to not use
              // index higher than 3. Instead of doing the patching here we just set a flag and will do it later,
              // to not complicate this loop.
              if (reg.isGpbHi()) {
                hasGpbHiConstraint = true;
                allowedRegs = 0x0Fu;
              }
            }
          }

          uint32_t vIndex = Operand::virtIdToIndex(reg.id());
          if (vIndex < Operand::kVirtIdCount) {
            RAWorkReg* workReg;
            ASMJIT_PROPAGATE(_pass->virtIndexAsWorkReg(vIndex, &workReg));

            // Use RW instead of Write in case that not the whole register is overwritten. This is important
            // for liveness as we cannot kill a register that will be used. For example `mov al, 0xFF` is not
            // a write-only operation if user allocated the whole `rax` register.
            if ((flags & RATiedFlags::kRW) == RATiedFlags::kWrite) {
              if (workReg->regByteMask() & ~(opRwInfo.writeByteMask() | opRwInfo.extendByteMask())) {
                // Not write-only operation.
                flags = (flags & ~RATiedFlags::kOut) | (RATiedFlags::kRead | RATiedFlags::kUse);
              }
            }

            // Do not use RegMem flag if changing Reg to Mem requires a CPU feature that is not available.
            if (rwInfo.rmFeature() && Support::test(flags, RATiedFlags::kUseRM | RATiedFlags::kOutRM)) {
              if (!cc()->code()->cpuFeatures().has(rwInfo.rmFeature())) {
                flags &= ~(RATiedFlags::kUseRM | RATiedFlags::kOutRM);
              }
            }

            RegGroup group = workReg->group();
            RegMask useRegs = _pass->_availableRegs[group] & allowedRegs;
            RegMask outRegs = useRegs;

            uint32_t useId = BaseReg::kIdBad;
            uint32_t outId = BaseReg::kIdBad;

            uint32_t useRewriteMask = 0;
            uint32_t outRewriteMask = 0;

            if (opRwInfo.consecutiveLeadCount()) {
              // There must be a single consecutive register lead, otherwise the RW data is invalid.
              if (consecutiveLeadId != Globals::kInvalidId)
                return DebugUtils::errored(kErrorInvalidState);

              // A consecutive lead register cannot be used as a consecutive +1/+2/+3 register, the registers must be distinct.
              if (RATiedReg::consecutiveDataFromFlags(flags) != 0)
                return DebugUtils::errored(kErrorNotConsecutiveRegs);

              flags |= RATiedFlags::kLeadConsecutive | RATiedReg::consecutiveDataToFlags(opRwInfo.consecutiveLeadCount() - 1);
              consecutiveLeadId = workReg->workId();

              RegMask filter = raConsecutiveLeadCountToRegMaskFilter[opRwInfo.consecutiveLeadCount()];
              if (Support::test(flags, RATiedFlags::kUse)) {
                flags |= RATiedFlags::kUseConsecutive;
                useRegs &= filter;
              }
              else {
                flags |= RATiedFlags::kOutConsecutive;
                outRegs &= filter;
              }
            }

            if (Support::test(flags, RATiedFlags::kUse)) {
              useRewriteMask = Support::bitMask(inst->getRewriteIndex(&reg._baseId));
              if (opRwInfo.hasOpFlag(OpRWFlags::kRegPhysId)) {
                useId = opRwInfo.physId();
                flags |= RATiedFlags::kUseFixed;
              }
              else if (opRwInfo.hasOpFlag(OpRWFlags::kConsecutive)) {
                if (consecutiveLeadId == Globals::kInvalidId)
                  return DebugUtils::errored(kErrorInvalidState);

                if (consecutiveLeadId == workReg->workId())
                  return DebugUtils::errored(kErrorOverlappedRegs);

                flags |= RATiedFlags::kUseConsecutive | RATiedReg::consecutiveDataToFlags(++consecutiveOffset);
              }
            }
            else {
              outRewriteMask = Support::bitMask(inst->getRewriteIndex(&reg._baseId));
              if (opRwInfo.hasOpFlag(OpRWFlags::kRegPhysId)) {
                outId = opRwInfo.physId();
                flags |= RATiedFlags::kOutFixed;
              }
              else if (opRwInfo.hasOpFlag(OpRWFlags::kConsecutive)) {
                if (consecutiveLeadId == Globals::kInvalidId)
                  return DebugUtils::errored(kErrorInvalidState);

                if (consecutiveLeadId == workReg->workId())
                  return DebugUtils::errored(kErrorOverlappedRegs);

                flags |= RATiedFlags::kOutConsecutive | RATiedReg::consecutiveDataToFlags(++consecutiveOffset);
              }
            }

            ASMJIT_PROPAGATE(ib.add(workReg, flags, useRegs, useId, useRewriteMask, outRegs, outId, outRewriteMask, opRwInfo.rmSize(), consecutiveParent));
            if (singleRegOps == i)
              singleRegOps++;

            if (Support::test(flags, RATiedFlags::kLeadConsecutive | RATiedFlags::kUseConsecutive | RATiedFlags::kOutConsecutive))
              consecutiveParent = workReg->workId();
          }
        }
        else if (op.isMem()) {
          // Memory Operand
          // --------------
          const Mem& mem = op.as<Mem>();
          ib.addForbiddenFlags(RATiedFlags::kUseRM | RATiedFlags::kOutRM);

          if (mem.isRegHome()) {
            RAWorkReg* workReg;
            ASMJIT_PROPAGATE(_pass->virtIndexAsWorkReg(Operand::virtIdToIndex(mem.baseId()), &workReg));
            _pass->getOrCreateStackSlot(workReg);
          }
          else if (mem.hasBaseReg()) {
            uint32_t vIndex = Operand::virtIdToIndex(mem.baseId());
            if (vIndex < Operand::kVirtIdCount) {
              RAWorkReg* workReg;
              ASMJIT_PROPAGATE(_pass->virtIndexAsWorkReg(vIndex, &workReg));

              RATiedFlags flags = raMemBaseRwFlags(opRwInfo.opFlags());
              RegGroup group = workReg->group();
              RegMask inOutRegs = _pass->_availableRegs[group];

              uint32_t useId = BaseReg::kIdBad;
              uint32_t outId = BaseReg::kIdBad;

              uint32_t useRewriteMask = 0;
              uint32_t outRewriteMask = 0;

              if (Support::test(flags, RATiedFlags::kUse)) {
                useRewriteMask = Support::bitMask(inst->getRewriteIndex(&mem._baseId));
                if (opRwInfo.hasOpFlag(OpRWFlags::kMemPhysId)) {
                  useId = opRwInfo.physId();
                  flags |= RATiedFlags::kUseFixed;
                }
              }
              else {
                outRewriteMask = Support::bitMask(inst->getRewriteIndex(&mem._baseId));
                if (opRwInfo.hasOpFlag(OpRWFlags::kMemPhysId)) {
                  outId = opRwInfo.physId();
                  flags |= RATiedFlags::kOutFixed;
                }
              }

              ASMJIT_PROPAGATE(ib.add(workReg, flags, inOutRegs, useId, useRewriteMask, inOutRegs, outId, outRewriteMask));
            }
          }

          if (mem.hasIndexReg()) {
            uint32_t vIndex = Operand::virtIdToIndex(mem.indexId());
            if (vIndex < Operand::kVirtIdCount) {
              RAWorkReg* workReg;
              ASMJIT_PROPAGATE(_pass->virtIndexAsWorkReg(vIndex, &workReg));

              RATiedFlags flags = raMemIndexRwFlags(opRwInfo.opFlags());
              RegGroup group = workReg->group();
              RegMask inOutRegs = _pass->_availableRegs[group] & instructionAllowedRegs;

              // Index registers have never fixed id on X86/x64.
              const uint32_t useId = BaseReg::kIdBad;
              const uint32_t outId = BaseReg::kIdBad;

              uint32_t useRewriteMask = 0;
              uint32_t outRewriteMask = 0;

              if (Support::test(flags, RATiedFlags::kUse))
                useRewriteMask = Support::bitMask(inst->getRewriteIndex(&mem._data[Operand::kDataMemIndexId]));
              else
                outRewriteMask = Support::bitMask(inst->getRewriteIndex(&mem._data[Operand::kDataMemIndexId]));

              ASMJIT_PROPAGATE(ib.add(workReg, RATiedFlags::kUse | RATiedFlags::kRead, inOutRegs, useId, useRewriteMask, inOutRegs, outId, outRewriteMask));
            }
          }
        }
      }
    }

    // Handle extra operand (either REP {cx|ecx|rcx} or AVX-512 {k} selector).
    if (inst->hasExtraReg()) {
      uint32_t vIndex = Operand::virtIdToIndex(inst->extraReg().id());
      if (vIndex < Operand::kVirtIdCount) {
        RAWorkReg* workReg;
        ASMJIT_PROPAGATE(_pass->virtIndexAsWorkReg(vIndex, &workReg));

        RegGroup group = workReg->group();
        RegMask inOutRegs = _pass->_availableRegs[group];
        uint32_t rewriteMask = Support::bitMask(inst->getRewriteIndex(&inst->extraReg()._id));

        if (group == RegGroup::kX86_K) {
          // AVX-512 mask selector {k} register - read-only, allocable to any register except {k0}.
          ASMJIT_PROPAGATE(ib.add(workReg, RATiedFlags::kUse | RATiedFlags::kRead, inOutRegs, BaseReg::kIdBad, rewriteMask, inOutRegs, BaseReg::kIdBad, 0));
          singleRegOps = 0;
        }
        else {
          // REP {cx|ecx|rcx} register - read & write, allocable to {cx|ecx|rcx} only.
          ASMJIT_PROPAGATE(ib.add(workReg, RATiedFlags::kUse | RATiedFlags::kRW, inOutRegs, Gp::kIdCx, rewriteMask, inOutRegs, Gp::kIdBad, 0));
        }
      }
      else {
        RegGroup group = inst->extraReg().group();
        if (group == RegGroup::kX86_K && inst->extraReg().id() != 0)
          singleRegOps = 0;
      }
    }

    // If this instruction has move semantics then check whether it could be eliminated if all virtual registers
    // are allocated into the same register. Take into account the virtual size of the destination register as that's
    // more important than a physical register size in this case.
    if (rwInfo.hasInstFlag(InstRWFlags::kMovOp) && !inst->hasExtraReg() && Support::bitTest(opTypesMask, uint32_t(OperandType::kReg))) {
      // AVX+ move instructions have 3 operand form - the first two operands must be the same to guarantee move semantics.
      if (opCount == 2 || (opCount == 3 && opArray[0] == opArray[1])) {
        uint32_t vIndex = Operand::virtIdToIndex(opArray[0].as<Reg>().id());
        if (vIndex < Operand::kVirtIdCount) {
          const VirtReg* vReg = _cc->virtRegByIndex(vIndex);
          const OpRWInfo& opRwInfo = rwInfo.operand(0);

          uint64_t remainingByteMask = vReg->workReg()->regByteMask() & ~opRwInfo.writeByteMask();
          if (remainingByteMask == 0u || (remainingByteMask & opRwInfo.extendByteMask()) == 0)
            ib.addInstRWFlags(InstRWFlags::kMovOp);
        }
      }
    }

    // Handle X86 constraints.
    if (hasGpbHiConstraint) {
      for (RATiedReg& tiedReg : ib) {
        RegMask filter = tiedReg.hasFlag(RATiedFlags::kX86_Gpb) ? 0x0Fu : 0xFFu;
        tiedReg._useRegMask &= filter;
        tiedReg._outRegMask &= filter;
      }
    }

    if (ib.tiedRegCount() == 1) {
      // Handle special cases of some instructions where all operands share the same
      // register. In such case the single operand becomes read-only or write-only.
      InstSameRegHint sameRegHint = InstSameRegHint::kNone;
      if (singleRegOps == opCount) {
        sameRegHint = instInfo.sameRegHint();
      }
      else if (opCount == 2 && inst->op(1).isImm()) {
        // Handle some tricks used by X86 asm.
        const BaseReg& reg = inst->op(0).as<BaseReg>();
        const Imm& imm = inst->op(1).as<Imm>();

        const RAWorkReg* workReg = _pass->workRegById(ib[0]->workId());
        uint32_t workRegSize = workReg->signature().size();

        switch (inst->id()) {
          case Inst::kIdOr: {
            // Sets the value of the destination register to -1, previous content unused.
            if (reg.size() >= 4 || reg.size() >= workRegSize) {
              if (imm.value() == -1 || imm.valueAs<uint64_t>() == raImmMaskFromSize(reg.size()))
                sameRegHint = InstSameRegHint::kWO;
            }
            ASMJIT_FALLTHROUGH;
          }

          case Inst::kIdAdd:
          case Inst::kIdAnd:
          case Inst::kIdRol:
          case Inst::kIdRor:
          case Inst::kIdSar:
          case Inst::kIdShl:
          case Inst::kIdShr:
          case Inst::kIdSub:
          case Inst::kIdXor: {
            // Updates [E|R]FLAGS without changing the content.
            if (reg.size() != 4 || reg.size() >= workRegSize) {
              if (imm.value() == 0)
                sameRegHint = InstSameRegHint::kRO;
            }
            break;
          }
        }
      }
      else if (opCount == 4 && inst->op(3).isImm()) {
        const Imm& imm = inst->op(3).as<Imm>();

        switch (inst->id()) {
          case Inst::kIdVpternlogd:
          case Inst::kIdVpternlogq: {
            uint32_t predicate = uint32_t(imm.value() & 0xFFu);
            if (predicate == 0x00u || predicate == 0xFFu) {
              ib[0]->makeWriteOnly();
            }
            break;
          }
        }
      }

      switch (sameRegHint) {
        case InstSameRegHint::kNone:
          break;
        case InstSameRegHint::kRO:
          ib[0]->makeReadOnly();
          break;
        case InstSameRegHint::kWO:
          ib[0]->makeWriteOnly();
          break;
      }
    }

    cf = instInfo.controlFlow();
  }

  return kErrorOk;
}